

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int quorem(Bigint *b,Bigint *S)

{
  int iVar1;
  uint32 *puVar2;
  ulong uVar3;
  uint32 *puVar4;
  bool bVar5;
  uint64 ys;
  uint64 y;
  uint64 carry;
  uint64 borrow;
  uint32 *sxe;
  uint32 *sx;
  uint32 *puStack_38;
  uint32 q;
  uint32 *bxe;
  uint32 *bx;
  int n;
  Bigint *S_local;
  Bigint *b_local;
  
  if (b->wds < S->wds) {
    b_local._4_4_ = 0;
  }
  else {
    bx._4_4_ = S->wds + -1;
    puVar2 = S->x + bx._4_4_;
    puStack_38 = b->x + bx._4_4_;
    sx._4_4_ = *puStack_38 / (*puVar2 + 1);
    if (sx._4_4_ != 0) {
      carry = 0;
      y = 0;
      sxe = S->x;
      bxe = b->x;
      do {
        puVar4 = sxe + 1;
        uVar3 = (ulong)*sxe * (ulong)sx._4_4_ + y;
        y = uVar3 >> 0x20;
        uVar3 = ((ulong)*bxe - (uVar3 & 0xffffffff)) - carry;
        carry = uVar3 >> 0x20 & 1;
        *bxe = (uint32)uVar3;
        sxe = puVar4;
        bxe = bxe + 1;
      } while (puVar4 <= puVar2);
      if (*puStack_38 == 0) {
        while( true ) {
          puStack_38 = puStack_38 + -1;
          bVar5 = false;
          if (b->x < puStack_38) {
            bVar5 = *puStack_38 == 0;
          }
          if (!bVar5) break;
          bx._4_4_ = bx._4_4_ + -1;
        }
        b->wds = bx._4_4_;
      }
    }
    iVar1 = cmp(b,S);
    if (-1 < iVar1) {
      sx._4_4_ = sx._4_4_ + 1;
      carry = 0;
      y = 0;
      sxe = S->x;
      bxe = b->x;
      do {
        puVar4 = sxe + 1;
        uVar3 = *sxe + y;
        y = uVar3 >> 0x20;
        uVar3 = ((ulong)*bxe - (uVar3 & 0xffffffff)) - carry;
        carry = uVar3 >> 0x20 & 1;
        *bxe = (uint32)uVar3;
        sxe = puVar4;
        bxe = bxe + 1;
      } while (puVar4 <= puVar2);
      puStack_38 = b->x + bx._4_4_;
      if (*puStack_38 == 0) {
        while( true ) {
          puStack_38 = puStack_38 + -1;
          bVar5 = false;
          if (b->x < puStack_38) {
            bVar5 = *puStack_38 == 0;
          }
          if (!bVar5) break;
          bx._4_4_ = bx._4_4_ + -1;
        }
        b->wds = bx._4_4_;
      }
    }
    b_local._4_4_ = sx._4_4_;
  }
  return b_local._4_4_;
}

Assistant:

static int
quorem(Bigint *b, Bigint *S)
{
    int n;
    ULong *bx, *bxe, q, *sx, *sxe;
#ifdef ULLong
    ULLong borrow, carry, y, ys;
#else
    ULong borrow, carry, y, ys;
    ULong si, z, zs;
#endif

    n = S->wds;
#ifdef DEBUG
    /*debug*/ if (b->wds > n)
        /*debug*/       Bug("oversize b in quorem");
#endif
    if (b->wds < n)
        return 0;
    sx = S->x;
    sxe = sx + --n;
    bx = b->x;
    bxe = bx + n;
    q = *bxe / (*sxe + 1);      /* ensure q <= true quotient */
#ifdef DEBUG
    /*debug*/ if (q > 9)
        /*debug*/       Bug("oversized quotient in quorem");
#endif
    if (q) {
        borrow = 0;
        carry = 0;
        do {
#ifdef ULLong
            ys = *sx++ * (ULLong)q + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) * q + carry;
            zs = (si >> 16) * q + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        if (!*bxe) {
            bx = b->x;
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    if (cmp(b, S) >= 0) {
        q++;
        borrow = 0;
        carry = 0;
        bx = b->x;
        sx = S->x;
        do {
#ifdef ULLong
            ys = *sx++ + carry;
            carry = ys >> 32;
            y = *bx - (ys & FFFFFFFF) - borrow;
            borrow = y >> 32 & (ULong)1;
            *bx++ = (ULong)(y & FFFFFFFF);
#else
            si = *sx++;
            ys = (si & 0xffff) + carry;
            zs = (si >> 16) + (ys >> 16);
            carry = zs >> 16;
            y = (*bx & 0xffff) - (ys & 0xffff) - borrow;
            borrow = (y & 0x10000) >> 16;
            z = (*bx >> 16) - (zs & 0xffff) - borrow;
            borrow = (z & 0x10000) >> 16;
            Storeinc(bx, z, y);
#endif
        }
        while(sx <= sxe);
        bx = b->x;
        bxe = bx + n;
        if (!*bxe) {
            while(--bxe > bx && !*bxe)
                --n;
            b->wds = n;
        }
    }
    return q;
}